

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *
fmt::v9::detail::
make_arg<fmt::v9::basic_printf_context<fmt::v9::appender,char>,fmt::v9::basic_string_view<char>>
          (basic_string_view<char> *value)

{
  size_t sVar1;
  size_t extraout_RDX;
  undefined8 *in_RSI;
  basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *in_RDI;
  basic_string_view<char> s;
  basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *arg;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  basic_string_view<char> *arg_1;
  basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>
  *in_stack_ffffffffffffff28;
  basic_string_view<char> *this;
  undefined1 local_79;
  char *local_78;
  size_t sStack_70;
  char **local_68;
  char *local_58 [2];
  detail *local_48;
  char *pcStack_40;
  undefined1 *local_30;
  basic_string_view<char> local_28;
  char **local_18;
  basic_string_view<char> local_10;
  
  basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::basic_format_arg
            (in_stack_ffffffffffffff28);
  in_RDI->type_ = string_type;
  local_30 = &local_79;
  local_48 = (detail *)*in_RSI;
  pcStack_40 = (char *)in_RSI[1];
  s.size_ = extraout_RDX;
  s.data_ = pcStack_40;
  local_28 = to_string_view<char>(local_48,s);
  local_78 = local_28.data_;
  sStack_70 = local_28.size_;
  local_68 = &local_78;
  local_10.data_ = local_28.data_;
  local_10.size_ = local_28.size_;
  local_18 = local_58;
  this = &local_10;
  local_58[0] = basic_string_view<char>::data(this);
  sVar1 = basic_string_view<char>::size(this);
  (in_RDI->value_).field_0.string.data = local_58[0];
  (in_RDI->value_).field_0.string.size = sVar1;
  return in_RDI;
}

Assistant:

FMT_CONSTEXPR auto make_arg(T&& value) -> basic_format_arg<Context> {
  basic_format_arg<Context> arg;
  arg.type_ = mapped_type_constant<T, Context>::value;
  arg.value_ = make_value<Context>(value);
  return arg;
}